

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui-term.c
# Opt level: O0

errr Term_fresh(void)

{
  wchar_t wVar1;
  wchar_t wVar2;
  wchar_t wVar3;
  term_win *ptVar4;
  term_win *ptVar5;
  void *pvVar6;
  int local_9c;
  int local_98;
  int local_94;
  wchar_t local_8c;
  wchar_t local_88;
  int local_84;
  wchar_t x2;
  wchar_t x1;
  wchar_t ipr;
  int **pr_drw;
  wchar_t tx;
  wchar_t ty;
  wchar_t mtx;
  wchar_t mty;
  wchar_t *tcc;
  int *taa;
  wchar_t *cc;
  int *aa;
  term_win *scr;
  term_win *old;
  wchar_t local_20;
  wchar_t y2;
  wchar_t y1;
  wchar_t h;
  wchar_t w;
  wchar_t y;
  wchar_t x;
  
  wVar1 = Term->wid;
  wVar2 = Term->hgt;
  local_20 = Term->y1;
  old._4_4_ = Term->y2;
  ptVar4 = Term->old;
  ptVar5 = Term->scr;
  if ((Term->mapped_flag & 1U) == 0) {
    y = L'\x01';
  }
  else if (((((old._4_4_ < local_20) && ((ptVar5->cu & 1U) == (ptVar4->cu & 1U))) &&
            ((ptVar5->cv & 1U) == (ptVar4->cv & 1U))) &&
           ((ptVar5->cx == ptVar4->cx && (ptVar5->cy == ptVar4->cy)))) &&
          ((ptVar5->cnx == ptVar4->cnx &&
           ((ptVar5->cny == ptVar4->cny && ((Term->total_erase & 1U) == 0)))))) {
    y = L'\x01';
  }
  else {
    if (Term->curs_hook == (_func_errr_wchar_t_wchar_t *)0x0) {
      Term->curs_hook = Term_curs_hack;
    }
    if (Term->bigcurs_hook == (_func_errr_wchar_t_wchar_t *)0x0) {
      Term->bigcurs_hook = Term->curs_hook;
    }
    if (Term->wipe_hook == (_func_errr_wchar_t_wchar_t_wchar_t *)0x0) {
      Term->wipe_hook = Term_wipe_hack;
    }
    if (Term->text_hook == (_func_errr_wchar_t_wchar_t_wchar_t_wchar_t_wchar_t_ptr *)0x0) {
      Term->text_hook = Term_text_hack;
    }
    if (Term->pict_hook ==
        (_func_errr_wchar_t_wchar_t_wchar_t_wchar_t_ptr_wchar_t_ptr_wchar_t_ptr_wchar_t_ptr *)0x0) {
      Term->pict_hook = Term_pict_hack;
    }
    if ((Term->total_erase & 1U) != 0) {
      Term_xtra(L'\x03',L'\0');
      ptVar4->cu = false;
      ptVar4->cv = false;
      ptVar4->cy = 0;
      ptVar4->cx = 0;
      ptVar4->cny = 1;
      ptVar4->cnx = 1;
      for (h = L'\0'; h < wVar2; h = h + L'\x01') {
        _mtx = ptVar4->tc[h];
        tcc = ptVar4->ta[h];
        taa = ptVar4->c[h];
        cc = ptVar4->a[h];
        for (w = L'\0'; w < wVar1; w = w + L'\x01') {
          *cc = L'\x01';
          *taa = 0x20;
          *tcc = L'\x01';
          *_mtx = L' ';
          _mtx = _mtx + 1;
          tcc = tcc + 1;
          taa = taa + 1;
          cc = cc + 1;
        }
      }
      local_20 = L'\0';
      Term->y1 = 0;
      old._4_4_ = wVar2 + L'\xffffffff';
      Term->y2 = old._4_4_;
      for (h = L'\0'; h < wVar2; h = h + L'\x01') {
        Term->x1[h] = 0;
        Term->x2[h] = wVar1 + L'\xffffffff';
      }
      Term->total_erase = false;
    }
    if ((Term->soft_cursor & 1U) == 0) {
      if (((ptVar5->cu & 1U) != 0) || ((ptVar5->cv & 1U) == 0)) {
        Term_xtra(L'\x04',L'\0');
      }
    }
    else if (((ptVar4->cu & 1U) == 0) && ((ptVar4->cv & 1U) != 0)) {
      wVar3 = wVar2;
      if (ptVar4->cy + ptVar4->cny + -1 <= wVar2 + L'\xffffffff') {
        wVar3 = ptVar4->cy + ptVar4->cny;
      }
      local_84 = wVar3 + L'\xffffffff';
      if (ptVar4->cy < local_84) {
        local_88 = wVar2;
        if (ptVar4->cy + ptVar4->cny + -1 <= wVar2 + L'\xffffffff') {
          local_88 = ptVar4->cy + ptVar4->cny;
        }
        local_88 = local_88 + L'\xffffffff';
        local_8c = local_88;
      }
      else {
        local_8c = ptVar4->cy;
      }
      wVar3 = wVar1;
      if (ptVar4->cx + ptVar4->cnx + -1 <= wVar1 + L'\xffffffff') {
        wVar3 = ptVar4->cx + ptVar4->cnx;
      }
      local_94 = wVar3 + L'\xffffffff';
      if (ptVar4->cx < local_94) {
        wVar3 = wVar1;
        if (ptVar4->cx + ptVar4->cnx + -1 <= wVar1 + L'\xffffffff') {
          wVar3 = ptVar4->cx + ptVar4->cnx;
        }
        local_98 = wVar3 + L'\xffffffff';
        local_9c = local_98;
      }
      else {
        local_9c = ptVar4->cx;
      }
      for (pr_drw._4_4_ = ptVar4->cy; pr_drw._4_4_ <= local_8c;
          pr_drw._4_4_ = pr_drw._4_4_ + L'\x01') {
        for (pr_drw._0_4_ = ptVar4->cx; (int)pr_drw <= local_9c; pr_drw._0_4_ = (int)pr_drw + 1) {
          ptVar4->c[pr_drw._4_4_][(int)pr_drw] = ptVar5->c[pr_drw._4_4_][(int)pr_drw] ^ 0xffffffff;
        }
        if (ptVar4->cx < Term->x1[pr_drw._4_4_]) {
          Term->x1[pr_drw._4_4_] = ptVar4->cx;
        }
        if (Term->x2[pr_drw._4_4_] < local_9c) {
          Term->x2[pr_drw._4_4_] = local_9c;
        }
      }
      if (ptVar4->cy < local_20) {
        local_20 = ptVar4->cy;
      }
      if (old._4_4_ < local_8c) {
        old._4_4_ = local_8c;
      }
    }
    if (local_20 <= old._4_4_) {
      if ((Term->dblh_hook == (_func_wchar_t_wchar_t_wchar_t *)0x0) ||
         (((Term->always_pict & 1U) == 0 && ((Term->higher_pict & 1U) == 0)))) {
        _x1 = (void *)0x0;
      }
      else {
        _x1 = mem_alloc((ulong)tile_height << 3);
        for (h = L'\0'; h < (int)(uint)tile_height; h = h + L'\x01') {
          pvVar6 = mem_zalloc((long)wVar1 << 2);
          *(void **)((long)_x1 + (long)h * 8) = pvVar6;
        }
      }
      if ((((Term->icky_corner & 1U) != 0) && (wVar2 + L'\xffffffff' <= old._4_4_)) &&
         (wVar1 + L'\xfffffffe' < Term->x2[wVar2 + L'\xffffffff'])) {
        Term->x2[wVar2 + L'\xffffffff'] = wVar1 + L'\xfffffffe';
      }
      Term->y1 = wVar2;
      Term->y2 = 0;
      x2 = L'\0';
      for (h = local_20; h <= old._4_4_; h = h + L'\x01') {
        wVar2 = Term->x1[h];
        wVar3 = Term->x2[h];
        if (wVar3 < wVar2) {
          if (_x1 != (void *)0x0) {
            for (w = L'\0'; w < wVar1; w = w + L'\x01') {
              *(undefined4 *)(*(long *)((long)_x1 + (long)x2 * 8) + (long)w * 4) = 0;
            }
            x2 = (x2 + L'\x01') % (int)(uint)tile_height;
          }
        }
        else {
          Term->x1[h] = wVar1;
          Term->x2[h] = 0;
          if ((Term->always_pict & 1U) == 0) {
            if ((Term->higher_pict & 1U) == 0) {
              Term_fresh_row_text(h,wVar2,wVar3);
            }
            else if (Term->dblh_hook == (_func_wchar_t_wchar_t_wchar_t *)0x0) {
              Term_fresh_row_both(h,wVar2,wVar3);
            }
            else {
              Term_fresh_row_both_dblh(h,wVar2,wVar3,*(int **)((long)_x1 + (long)x2 * 8));
              x2 = (x2 + L'\x01') % (int)(uint)tile_height;
            }
          }
          else if (Term->dblh_hook == (_func_wchar_t_wchar_t_wchar_t *)0x0) {
            Term_fresh_row_pict(h,wVar2,wVar3);
          }
          else {
            Term_fresh_row_pict_dblh(h,wVar2,wVar3,*(int **)((long)_x1 + (long)x2 * 8));
            x2 = (x2 + L'\x01') % (int)(uint)tile_height;
          }
          if ((Term->never_frosh & 1U) == 0) {
            Term_xtra(L'\x05',h);
          }
        }
      }
      if (_x1 != (void *)0x0) {
        for (h = L'\0'; h < (int)(uint)tile_height; h = h + L'\x01') {
          mem_free(*(void **)((long)_x1 + (long)h * 8));
        }
        mem_free(_x1);
      }
    }
    if ((Term->soft_cursor & 1U) == 0) {
      if ((ptVar5->cu & 1U) == 0) {
        if ((ptVar5->cv & 1U) == 0) {
          (*Term->curs_hook)(ptVar5->cx,ptVar5->cy);
        }
        else {
          (*Term->curs_hook)(ptVar5->cx,ptVar5->cy);
          Term_xtra(L'\x04',L'\x01');
        }
      }
      else {
        (*Term->curs_hook)(wVar1 + L'\xffffffff',ptVar5->cy);
      }
      ptVar5->cnx = 1;
      ptVar5->cny = 1;
    }
    else if (((ptVar5->cu & 1U) == 0) && ((ptVar5->cv & 1U) != 0)) {
      if ((((tile_width < 2) && (tile_height < 2)) ||
          (((smlcurs & 1U) != 0 || ((Term->saved != '\0' || (ptVar5->cy < 1)))))) &&
         ((bigcurs & 1U) == 0)) {
        (*Term->curs_hook)(ptVar5->cx,ptVar5->cy);
        ptVar5->cnx = 1;
        ptVar5->cny = 1;
      }
      else {
        (*Term->bigcurs_hook)(ptVar5->cx,ptVar5->cy);
        ptVar5->cnx = (uint)tile_width;
        ptVar5->cny = (uint)tile_height;
      }
    }
    else {
      ptVar5->cnx = 1;
      ptVar5->cny = 1;
    }
    ptVar4->cu = (_Bool)(ptVar5->cu & 1);
    ptVar4->cv = (_Bool)(ptVar5->cv & 1);
    ptVar4->cx = ptVar5->cx;
    ptVar4->cy = ptVar5->cy;
    ptVar4->cnx = ptVar5->cnx;
    ptVar4->cny = ptVar5->cny;
    Term_xtra(L'\x06',L'\0');
    y = L'\0';
  }
  return y;
}

Assistant:

errr Term_fresh(void)
{
	int x, y;

	int w = Term->wid;
	int h = Term->hgt;

	int y1 = Term->y1;
	int y2 = Term->y2;

	term_win *old = Term->old;
	term_win *scr = Term->scr;


	/* Do nothing unless "mapped" */
	if (!Term->mapped_flag) return (1);


	/* Trivial Refresh */
	if ((y1 > y2) &&
	    (scr->cu == old->cu) &&
	    (scr->cv == old->cv) &&
	    (scr->cx == old->cx) &&
	    (scr->cy == old->cy) &&
	    (scr->cnx == old->cnx) &&
	    (scr->cny == old->cny) &&
	    !(Term->total_erase)) {
		/* Nothing */
		return (1);
	}


	/* Paranoia -- use "fake" hooks to prevent core dumps */
	if (!Term->curs_hook) Term->curs_hook = Term_curs_hack;
	if (!Term->bigcurs_hook) Term->bigcurs_hook = Term->curs_hook;
	if (!Term->wipe_hook) Term->wipe_hook = Term_wipe_hack;
	if (!Term->text_hook) Term->text_hook = Term_text_hack;
	if (!Term->pict_hook) Term->pict_hook = Term_pict_hack;


	/* Handle "total erase" */
	if (Term->total_erase) {
		/* Physically erase the entire window */
		Term_xtra(TERM_XTRA_CLEAR, 0);

		/* Hack -- clear all "cursor" data */
		old->cv = old->cu = false;
		old->cx = old->cy = 0;
		old->cnx = old->cny = 1;

		/* Wipe each row */
		for (y = 0; y < h; y++) {
			int *aa = old->a[y];
			wchar_t *cc = old->c[y];
			int *taa = old->ta[y];
			wchar_t *tcc = old->tc[y];

			/* Wipe each column */
			for (x = 0; x < w; x++) {
				/* Wipe each grid */
				*aa++ = COLOUR_WHITE;
				*cc++ = ' ';

				*taa++ = COLOUR_WHITE;
				*tcc++ = ' ';
			}
		}

		/* Redraw every row */
		Term->y1 = y1 = 0;
		Term->y2 = y2 = h - 1;

		/* Redraw every column */
		for (y = 0; y < h; y++) {
			Term->x1[y] = 0;
			Term->x2[y] = w - 1;
		}

		/* Forget "total erase" */
		Term->total_erase = false;
	}


	/* Cursor update -- Erase old Cursor */
	if (Term->soft_cursor) {
		/* Cursor was visible */
		if (!old->cu && old->cv) {
		        /*
		         * Fake a change at the old cursor position so that
		         * position will be redrawn along with any other
			 * changes.
			 */
			int mty = MAX(old->cy,
				MIN(old->cy + old->cny - 1, h - 1));
			int mtx = MAX(old->cx,
				MIN(old->cx + old->cnx - 1, w - 1));
			int ty;

			for (ty = old->cy; ty <= mty; ++ty) {
				int tx;

				for (tx = old->cx; tx <= mtx; ++tx) {
					old->c[ty][tx] = ~scr->c[ty][tx];
				}
				if (Term->x1[ty] > old->cx) {
					Term->x1[ty] = old->cx;
				}
				if (Term->x2[ty] < mtx) {
					Term->x2[ty] = mtx;
				}
			}
			if (y1 > old->cy) {
			    y1 = old->cy;
			}
			if (y2 < mty) {
			    y2 = mty;
			}
		}
	} else {
		/* Cursor will be invisible */
		if (scr->cu || !scr->cv)
			Term_xtra(TERM_XTRA_SHAPE, 0);
	}


	/* Something to update */
	if (y1 <= y2) {
		int **pr_drw;
		int ipr;

		if (Term->dblh_hook && (Term->always_pict ||
				Term->higher_pict)) {
			/*
			 * Have to track whether each location in the previous
			 * tile_height rows was redrawn.  First dimension in
			 * pr_drw will be treated circularly so there's no
			 * need for copying or swapping pointers.
			 */
			pr_drw = mem_alloc(tile_height * sizeof(*pr_drw));
			for (y = 0; y < tile_height; ++y) {
				pr_drw[y] = mem_zalloc(w * sizeof(**pr_drw));
			}
		} else {
			pr_drw = NULL;
		}

		/* Handle "icky corner" */
		if ((Term->icky_corner) && (y2 >= h - 1) && (Term->x2[h - 1] > w - 2))
			Term->x2[h - 1] = w - 2;


		/*
		 * Make the stored y bounds for the modified region empty.
		 * Do so before drawing so that Term_mark() calls from within
		 * the drawing hooks will adjust the bounds on the modified
		 * region for the next update.
		 */
		Term->y1 = h;
		Term->y2 = 0;

		/* Scan the "modified" rows */
		ipr = 0;
		for (y = y1; y <= y2; ++y) {
			int x1 = Term->x1[y];
			int x2 = Term->x2[y];

			/* Flush each "modified" row */
			if (x1 <= x2) {
				/*
				 * As above, set the bounds for the modified
				 * region to be empty before drawing.
				 */
				Term->x1[y] = w;
				Term->x2[y] = 0;

				/* Use "Term_pict()" - always, sometimes or never */
				if (Term->always_pict) {
					/* Flush the row */
					if (Term->dblh_hook) {
						Term_fresh_row_pict_dblh(
							y, x1, x2, pr_drw[ipr]);
						ipr = (ipr + 1) % tile_height;
					} else {
						Term_fresh_row_pict(y, x1, x2);
					}
				} else if (Term->higher_pict) {
					/* Flush the row */
					if (Term->dblh_hook) {
						Term_fresh_row_both_dblh(
							y, x1, x2, pr_drw[ipr]);
						ipr = (ipr + 1) % tile_height;
					} else {
						Term_fresh_row_both(y, x1, x2);
					}
				} else {
					/* Flush the row */
					Term_fresh_row_text(y, x1, x2);
				}
				/* Hack -- Flush that row (if allowed) */
				if (!Term->never_frosh) Term_xtra(TERM_XTRA_FROSH, y);
			} else if (pr_drw) {
				/*
				 * Remember that nothing was redrawn on that
				 * row.
				 */
				for (x = 0; x < w; ++x) {
					pr_drw[ipr][x] = 0;
				}
				ipr = (ipr + 1) % tile_height;
			}
		}

		if (pr_drw) {
			for (y = 0; y < tile_height; ++y) {
				mem_free(pr_drw[y]);
			}
			mem_free(pr_drw);
		}
	}


	/* Cursor update -- Show new Cursor */
	if (Term->soft_cursor) {
		/* Draw the (large or small) cursor */
		if (!scr->cu && scr->cv) {
			if ((((tile_width > 1)||(tile_height > 1)) &&
			     (!smlcurs) && (Term->saved == 0) && (scr->cy > 0))
			    || bigcurs) {
				(void)((*Term->bigcurs_hook)(scr->cx, scr->cy));
				scr->cnx = tile_width;
				scr->cny = tile_height;
			} else {
				(void)((*Term->curs_hook)(scr->cx, scr->cy));
				scr->cnx = 1;
				scr->cny = 1;
			}
		} else {
			scr->cnx = 1;
			scr->cny = 1;
		}
	} else {
		/* The cursor is useless or invisible ignore it, otherwise display */
		if (scr->cu) {
			/* Paranoia -- Put the cursor NEAR where it belongs */
			(void)((*Term->curs_hook)(w - 1, scr->cy));
		} else if (!scr->cv) {
			/* Paranoia -- Put the cursor where it belongs */
			(void)((*Term->curs_hook)(scr->cx, scr->cy));
		} else {
			/* Put the cursor where it belongs */
			(void)((*Term->curs_hook)(scr->cx, scr->cy));

			/* Make the cursor visible */
			Term_xtra(TERM_XTRA_SHAPE, 1);
		}

		scr->cnx = 1;
		scr->cny = 1;
	}

	/* Save the "cursor state" */
	old->cu = scr->cu;
	old->cv = scr->cv;
	old->cx = scr->cx;
	old->cy = scr->cy;
	old->cnx = scr->cnx;
	old->cny = scr->cny;

	/* Actually flush the output */
	Term_xtra(TERM_XTRA_FRESH, 0);

	/* Success */
	return (0);
}